

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout_p.h
# Opt level: O0

uint qConvertArgb32ToA2rgb30<(QtPixelOrder)1>(QRgb c)

{
  QRgb QVar1;
  QRgb unaff_retaddr;
  
  QVar1 = qRepremultiply<6u>(unaff_retaddr);
  return QVar1 & 0xc0000000 | (QVar1 & 0xff) << 0x16 | (QVar1 & 0xc0) << 0xe |
         (QVar1 & 0xff00) << 4 | QVar1 >> 4 & 0xc00 | QVar1 >> 0xe & 0x3fc | QVar1 >> 0x16 & 3;
}

Assistant:

inline uint qConvertArgb32ToA2rgb30<PixelOrderBGR>(QRgb c)
{
    c = qRepremultiply<6>(c);
    return (c & 0xc0000000)
        | (((c << 22) & 0x3fc00000) | ((c << 14) & 0x00300000))
        | (((c << 4)  & 0x000ff000) | ((c >> 4)  & 0x00000c00))
        | (((c >> 14) & 0x000003fc) | ((c >> 22) & 0x00000003));
}